

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<const_char_*const> * __thiscall
kj::heapArray<char_const*const,char_const*const*>
          (Array<const_char_*const> *__return_storage_ptr__,kj *this,char **begin,char **end)

{
  char **ppcVar1;
  long lVar2;
  Array<const_char_*const> *result;
  ArrayBuilder<const_char_*const> local_38;
  
  ppcVar1 = _::HeapArrayDisposer::allocateUninitialized<char_const*>((long)begin - (long)this >> 3);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  for (lVar2 = 0; this + lVar2 != (kj *)begin; lVar2 = lVar2 + 8) {
    *(char **)((long)ppcVar1 + lVar2) = *(char **)(this + lVar2);
  }
  __return_storage_ptr__->ptr = ppcVar1;
  __return_storage_ptr__->size_ = lVar2 >> 3;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_38.ptr = (char **)0x0;
  local_38.pos = (RemoveConst<const_char_*const> *)0x0;
  local_38.endPtr = (char **)0x0;
  ArrayBuilder<const_char_*const>::dispose(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}